

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O0

void __thiscall
ExtPrivkey_DerivePrivkeyTest_Test::~ExtPrivkey_DerivePrivkeyTest_Test
          (ExtPrivkey_DerivePrivkeyTest_Test *this)

{
  ExtPrivkey_DerivePrivkeyTest_Test *this_local;
  
  ~ExtPrivkey_DerivePrivkeyTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtPrivkey, DerivePrivkeyTest) {
  std::string ext_base58 = "xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV";
  ExtPrivkey extkey = ExtPrivkey(ext_base58);
  ExtPrivkey child;
  ExtPrivkey child1;
  ExtPrivkey child2;
  std::vector<uint32_t> path = {0, 44};

  child = extkey.DerivePrivkey(path);
  EXPECT_STREQ("0488ade40691fe4d290000002c368a8a370cc1f3e76cba08f13542e0dfb4e77dd08e8c70353f357a32b90be9d00005c52ec06dee7aa3249d9f8f3b930709967a43001fc8b9889eb22a850438ecc9", child.GetData().GetHex().c_str());
  EXPECT_STREQ("xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", child.ToString().c_str());
  EXPECT_TRUE(child.IsValid());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, child.GetVersion());
  EXPECT_EQ(6, child.GetDepth());
  EXPECT_EQ(44, child.GetChildNum());

  child1 = extkey.DerivePrivkey(0);
  EXPECT_STREQ("0488ade405ae05dbb7000000006abdc0ea6ae90c728659358371f9e576271ab7c2f0113e9128fa8b64b05a5a3f00d77115d2a8d35623ed755a2dd7c5cfd95256f7266dd3e55e3d8790d9758fe77a", child1.GetData().GetHex().c_str());
  EXPECT_STREQ("xprvA3hskUkqh1sEWhr726RLmGX7CwQ4jBHtY8ebnDijPhKNTiaCdBCdQe5UfvNFTZXwMm3vGktGpBWKZWCFbhQn5xYdHRPeaLpjCtVHSgoxS6E", child1.ToString().c_str());
  EXPECT_TRUE(child1.IsValid());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, child1.GetVersion());
  EXPECT_EQ(5, child1.GetDepth());
  EXPECT_EQ(0, child1.GetChildNum());

  child2 = child1.DerivePrivkey(44);
  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_EQ(child2.GetChildNum(), child.GetChildNum());

  child2 = extkey.DerivePrivkey("0/44");
  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_EQ(child2.GetChildNum(), child.GetChildNum());

  EXPECT_THROW((child2 = extkey.DerivePrivkey("m/0/44")), CfdException);

  // KeyData
  KeyData data1 = extkey.DerivePrivkeyData("0/44");
  EXPECT_STREQ("[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data1.ToString(false).c_str());
  EXPECT_STREQ("xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data1.GetExtPrivkey().ToString().c_str());

  KeyData data2 = extkey.DerivePrivkeyData(path);
  EXPECT_STREQ("[ae05dbb7/0/44]xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data2.ToString(false).c_str());
  EXPECT_STREQ("xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN", data2.GetExtPrivkey().ToString().c_str());
}